

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O0

_Bool append_object_curse(object *obj,wchar_t pick,wchar_t power)

{
  ushort uVar1;
  bool bVar2;
  curse *pcVar3;
  _Bool _Var4;
  effect_index eVar5;
  wchar_t wVar6;
  curse_data *pcVar7;
  timed_failure *local_38;
  timed_failure *f;
  wchar_t idx;
  wchar_t i;
  curse *c;
  wchar_t power_local;
  wchar_t pick_local;
  object *obj_local;
  
  pcVar3 = curses;
  if (obj->curses == (curse_data *)0x0) {
    pcVar7 = (curse_data *)mem_zalloc((ulong)z_info->curse_max << 3);
    obj->curses = pcVar7;
  }
  for (f._4_4_ = L'\x01'; f._4_4_ < (int)(uint)z_info->curse_max; f._4_4_ = f._4_4_ + L'\x01') {
    if ((obj->curses[f._4_4_].power != L'\0') && (_Var4 = curses_conflict(f._4_4_,pick), _Var4)) {
      check_object_curses(obj);
      return false;
    }
  }
  if (((pcVar3[pick].obj)->effect != (effect *)0x0) &&
     (uVar1 = (pcVar3[pick].obj)->effect->index, eVar5 = effect_lookup("TIMED_INC"), uVar1 == eVar5)
     ) {
    wVar6 = (pcVar3[pick].obj)->effect->subtype;
    if ((wVar6 < L'\0') || (L'4' < wVar6)) {
      __assert_fail("idx >= 0 && idx < TMD_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-curse.c"
                    ,0xa5,"_Bool append_object_curse(struct object *, int, int)");
    }
    for (local_38 = timed_effects[wVar6].fail; local_38 != (timed_failure *)0x0;
        local_38 = local_38->next) {
      if (local_38->code == 1) {
        _Var4 = flag_has_dbg(obj->flags,6,local_38->idx,"obj->flags","f->idx");
        if (_Var4) {
          check_object_curses(obj);
          return false;
        }
      }
      else if (local_38->code == 2) {
        if ((local_38->idx < 0) || (0x1b < local_38->idx)) {
          __assert_fail("f->idx >= 0 && f->idx < ELEM_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-curse.c"
                        ,0xae,"_Bool append_object_curse(struct object *, int, int)");
        }
        if (obj->el_info[local_38->idx].res_level < 0x51) {
          check_object_curses(obj);
          return false;
        }
      }
      else if (local_38->code == 3) {
        if ((local_38->idx < 0) || (0x1b < local_38->idx)) {
          __assert_fail("f->idx >= 0 && f->idx < ELEM_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-curse.c"
                        ,0xb5,"_Bool append_object_curse(struct object *, int, int)");
        }
        if (100 < obj->el_info[local_38->idx].res_level) {
          check_object_curses(obj);
          return false;
        }
      }
    }
  }
  f._4_4_ = flag_next(pcVar3[pick].conflict_flags,6,1);
  while( true ) {
    if (f._4_4_ == 0) {
      bVar2 = power <= obj->curses[pick].power;
      if (bVar2) {
        check_object_curses(obj);
      }
      else {
        obj->curses[pick].power = power;
        wVar6 = randcalc((pcVar3[pick].obj)->time,0,RANDOMISE);
        obj->curses[pick].timeout = wVar6;
      }
      obj_local._7_1_ = !bVar2;
      return obj_local._7_1_;
    }
    _Var4 = flag_has_dbg(obj->flags,6,f._4_4_,"obj->flags","i");
    if (_Var4) break;
    f._4_4_ = flag_next(pcVar3[pick].conflict_flags,6,f._4_4_ + 1);
  }
  check_object_curses(obj);
  return false;
}

Assistant:

bool append_object_curse(struct object *obj, int pick, int power)
{
	struct curse *c = &curses[pick];
	int i;

	if (!obj->curses)
		obj->curses = mem_zalloc(z_info->curse_max * sizeof(struct curse_data));

	/* Reject conflicting curses */
	for (i = 1; i < z_info->curse_max; i++) {
		if (obj->curses[i].power && curses_conflict(i, pick)) {
			check_object_curses(obj);
			return false;
		}
	}

	/* Reject curses with effects foiled by an existing object property */
	if (c->obj->effect && c->obj->effect->index
			== effect_lookup("TIMED_INC")) {
		int idx = c->obj->effect->subtype;
		const struct timed_failure *f;

		assert(idx >= 0 && idx < TMD_MAX);
		f = timed_effects[idx].fail;
		while (f) {
			if (f->code == TMD_FAIL_FLAG_OBJECT) {
				if (of_has(obj->flags, f->idx)) {
					check_object_curses(obj);
					return false;
				}
			} else if (f->code == TMD_FAIL_FLAG_RESIST) {
				assert(f->idx >= 0 && f->idx < ELEM_MAX);
				if (obj->el_info[f->idx].res_level
						<= RES_LEVEL_EFFECT) {
					check_object_curses(obj);
					return false;
				}
			} else if (f->code == TMD_FAIL_FLAG_VULN) {
				assert(f->idx >= 0 && f->idx < ELEM_MAX);
				if (obj->el_info[f->idx].res_level
						> RES_LEVEL_BASE) {
					check_object_curses(obj);
					return false;
				}
			}
			f = f->next;
		}
	}

	/* Reject curses which explicitly conflict with an object property */
	for (i = of_next(c->conflict_flags, FLAG_START); i != FLAG_END;
		 i = of_next(c->conflict_flags, i + 1)) {
		if (of_has(obj->flags, i)) {
			check_object_curses(obj);
			return false;
		}
	}

	/* Adjust power if our pick is a duplicate */
	if (power > obj->curses[pick].power) {
		obj->curses[pick].power = power;
		obj->curses[pick].timeout = randcalc(c->obj->time, 0, RANDOMISE);
		return true;
	}

	check_object_curses(obj);
	return false;
}